

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O0

bool bssl::tls13_add_certificate(SSL_HANDSHAKE *hs)

{
  undefined1 *cbb_00;
  SSL *ssl_00;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var1;
  bool bVar2;
  int iVar3;
  cbb_st *pcVar4;
  pointer this;
  pointer psVar5;
  CRYPTO_BUFFER *pCVar6;
  uint8_t *puVar7;
  size_t sVar8;
  pointer pcVar9;
  pointer psVar10;
  CertCompressionAlg *pCVar11;
  uchar *puVar12;
  Array<unsigned_char> *pAVar13;
  byte local_4d1;
  Span<const_unsigned_char> local_328;
  Span<const_unsigned_char> local_318;
  Span<unsigned_char> local_308;
  Span<const_unsigned_char> local_2f8;
  Span<const_unsigned_char> local_2e8;
  pointer local_2d8;
  SSL_HANDSHAKE_HINTS *hints;
  CBB compressed;
  CertCompressionAlg *candidate;
  CertCompressionAlg *__end1;
  CertCompressionAlg *__begin1;
  Vector<bssl::CertCompressionAlg> *__range1;
  CertCompressionAlg *alg;
  Array<unsigned_char> msg;
  CBB child_1;
  CRYPTO_BUFFER *cert_buf;
  size_t i;
  CBB empty_contents;
  CBB child;
  CBB ocsp_response;
  CBB contents_1;
  CBB contents;
  CBB extensions;
  CBB leaf;
  CRYPTO_BUFFER *leaf_buf;
  undefined1 local_c0 [8];
  CBB certificate_list;
  CBB body_storage;
  CBB *body;
  ScopedCBB cbb;
  SSL_CREDENTIAL *cred;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  cbb.ctx_.u._24_8_ =
       std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::get(&hs->credential);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
  if ((*(uint *)&hs->field_0x6c8 >> 0x15 & 1) == 0) {
    body_storage.u._24_8_ = &certificate_list.u.base.field_0x18;
    p_Var1 = ssl_00->method->init_message;
    pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
    bVar2 = (*p_Var1)(ssl_00,pcVar4,(CBB *)body_storage.u._24_8_,'\v');
    if (!bVar2) {
      hs_local._7_1_ = false;
      goto LAB_001c3466;
    }
  }
  else {
    pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
    iVar3 = CBB_init(pcVar4,0x400);
    if (iVar3 == 0) {
      hs_local._7_1_ = false;
      goto LAB_001c3466;
    }
    body_storage.u._24_8_ =
         internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
  }
  iVar3 = CBB_add_u8((CBB *)body_storage.u._24_8_,'\0');
  if ((iVar3 == 0) ||
     (iVar3 = CBB_add_u24_length_prefixed((CBB *)body_storage.u._24_8_,(CBB *)local_c0), iVar3 == 0)
     ) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x1ae);
    hs_local._7_1_ = false;
    goto LAB_001c3466;
  }
  bVar2 = std::operator==(&hs->credential,(nullptr_t)0x0);
  if (bVar2) {
    pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
    hs_local._7_1_ = ssl_add_message_cbb(ssl_00,pcVar4);
    goto LAB_001c3466;
  }
  this = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->(&hs->credential);
  bVar2 = ssl_credential_st::UsesX509(this);
  if (!bVar2) {
    __assert_fail("hs->credential->UsesX509()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x1b6,"bool bssl::tls13_add_certificate(SSL_HANDSHAKE *)");
  }
  psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                     ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                      (cbb.ctx_.u._24_8_ + 0x30));
  pCVar6 = sk_CRYPTO_BUFFER_value(psVar5,0);
  iVar3 = CBB_add_u24_length_prefixed((CBB *)local_c0,(CBB *)((long)&extensions.u + 0x18));
  if (iVar3 != 0) {
    puVar7 = CRYPTO_BUFFER_data(pCVar6);
    sVar8 = CRYPTO_BUFFER_len(pCVar6);
    iVar3 = CBB_add_bytes((CBB *)((long)&extensions.u + 0x18),puVar7,sVar8);
    if ((iVar3 != 0) &&
       (iVar3 = CBB_add_u16_length_prefixed((CBB *)local_c0,(CBB *)((long)&contents.u + 0x18)),
       iVar3 != 0)) {
      if (((*(uint *)&hs->field_0x6c8 >> 2 & 1) != 0) &&
         (bVar2 = std::operator!=((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                  (cbb.ctx_.u._24_8_ + 0x48),(nullptr_t)0x0), bVar2)) {
        iVar3 = CBB_add_u16((CBB *)((long)&contents.u + 0x18),0x12);
        if ((iVar3 != 0) &&
           (iVar3 = CBB_add_u16_length_prefixed
                              ((CBB *)((long)&contents.u + 0x18),(CBB *)((long)&contents_1.u + 0x18)
                              ), iVar3 != 0)) {
          pcVar9 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              (cbb.ctx_.u._24_8_ + 0x48));
          puVar7 = CRYPTO_BUFFER_data(pcVar9);
          pcVar9 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              (cbb.ctx_.u._24_8_ + 0x48));
          sVar8 = CRYPTO_BUFFER_len(pcVar9);
          iVar3 = CBB_add_bytes((CBB *)((long)&contents_1.u + 0x18),puVar7,sVar8);
          if ((iVar3 != 0) && (iVar3 = CBB_flush((CBB *)((long)&contents.u + 0x18)), iVar3 != 0))
          goto LAB_001c27f3;
        }
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x1ca);
        hs_local._7_1_ = false;
        goto LAB_001c3466;
      }
LAB_001c27f3:
      if (((*(uint *)&hs->field_0x6c8 >> 7 & 1) != 0) &&
         (bVar2 = std::operator!=((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                  (cbb.ctx_.u._24_8_ + 0x50),(nullptr_t)0x0), bVar2)) {
        iVar3 = CBB_add_u16((CBB *)((long)&contents.u + 0x18),5);
        if ((iVar3 != 0) &&
           (((iVar3 = CBB_add_u16_length_prefixed
                                ((CBB *)((long)&contents.u + 0x18),
                                 (CBB *)((long)&ocsp_response.u + 0x18)), iVar3 != 0 &&
             (iVar3 = CBB_add_u8((CBB *)((long)&ocsp_response.u + 0x18),'\x01'), iVar3 != 0)) &&
            (iVar3 = CBB_add_u24_length_prefixed
                               ((CBB *)((long)&ocsp_response.u + 0x18),
                                (CBB *)((long)&child.u + 0x18)), iVar3 != 0)))) {
          pcVar9 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              (cbb.ctx_.u._24_8_ + 0x50));
          puVar7 = CRYPTO_BUFFER_data(pcVar9);
          pcVar9 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              (cbb.ctx_.u._24_8_ + 0x50));
          sVar8 = CRYPTO_BUFFER_len(pcVar9);
          iVar3 = CBB_add_bytes((CBB *)((long)&child.u + 0x18),puVar7,sVar8);
          if ((iVar3 != 0) && (iVar3 = CBB_flush((CBB *)((long)&contents.u + 0x18)), iVar3 != 0))
          goto LAB_001c2989;
        }
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x1d9);
        hs_local._7_1_ = false;
        goto LAB_001c3466;
      }
LAB_001c2989:
      if (*(int *)(cbb.ctx_.u._24_8_ + 4) == 1) {
        iVar3 = CBB_add_u16((CBB *)((long)&contents.u + 0x18),0x22);
        if ((iVar3 != 0) &&
           (iVar3 = CBB_add_u16_length_prefixed
                              ((CBB *)((long)&contents.u + 0x18),
                               (CBB *)((long)&empty_contents.u + 0x18)), iVar3 != 0)) {
          pcVar9 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              (cbb.ctx_.u._24_8_ + 0x38));
          puVar7 = CRYPTO_BUFFER_data(pcVar9);
          pcVar9 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              (cbb.ctx_.u._24_8_ + 0x38));
          sVar8 = CRYPTO_BUFFER_len(pcVar9);
          iVar3 = CBB_add_bytes((CBB *)((long)&empty_contents.u + 0x18),puVar7,sVar8);
          if ((iVar3 != 0) && (iVar3 = CBB_flush((CBB *)((long)&contents.u + 0x18)), iVar3 != 0))
          goto LAB_001c2aa6;
        }
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x1e5);
        hs_local._7_1_ = false;
        goto LAB_001c3466;
      }
LAB_001c2aa6:
      if (((*(uint *)&hs->field_0x6c8 >> 0x1a & 1) != 0) &&
         (((iVar3 = CBB_add_u16((CBB *)((long)&contents.u + 0x18),0xca34), iVar3 == 0 ||
           (iVar3 = CBB_add_u16_length_prefixed((CBB *)((long)&contents.u + 0x18),(CBB *)&i),
           iVar3 == 0)) || (iVar3 = CBB_flush((CBB *)((long)&contents.u + 0x18)), iVar3 == 0)))) {
        hs_local._7_1_ = false;
        goto LAB_001c3466;
      }
      cert_buf = (CRYPTO_BUFFER *)0x1;
      while( true ) {
        psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                           ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                            (cbb.ctx_.u._24_8_ + 0x30));
        pCVar6 = (CRYPTO_BUFFER *)sk_CRYPTO_BUFFER_num(psVar5);
        if (pCVar6 <= cert_buf) break;
        psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                           ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                            (cbb.ctx_.u._24_8_ + 0x30));
        pCVar6 = sk_CRYPTO_BUFFER_value(psVar5,(size_t)cert_buf);
        iVar3 = CBB_add_u24_length_prefixed((CBB *)local_c0,(CBB *)&msg.size_);
        if (iVar3 == 0) {
LAB_001c2c5a:
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                        ,0x1fb);
          hs_local._7_1_ = false;
          goto LAB_001c3466;
        }
        puVar7 = CRYPTO_BUFFER_data(pCVar6);
        sVar8 = CRYPTO_BUFFER_len(pCVar6);
        iVar3 = CBB_add_bytes((CBB *)&msg.size_,puVar7,sVar8);
        if ((iVar3 == 0) || (iVar3 = CBB_add_u16((CBB *)local_c0,0), iVar3 == 0)) goto LAB_001c2c5a;
        cert_buf = (CRYPTO_BUFFER *)((long)&cert_buf->pool + 1);
      }
      if ((*(uint *)&hs->field_0x6c8 >> 0x15 & 1) == 0) {
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
        hs_local._7_1_ = ssl_add_message_cbb(ssl_00,pcVar4);
        goto LAB_001c3466;
      }
      Array<unsigned_char>::Array((Array<unsigned_char> *)&alg);
      pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
      bVar2 = CBBFinishArray(pcVar4,(Array<unsigned_char> *)&alg);
      if (bVar2) {
        __range1 = (Vector<bssl::CertCompressionAlg> *)0x0;
        psVar10 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
        __end1 = Vector<bssl::CertCompressionAlg>::begin(&psVar10->cert_compression_algs);
        pCVar11 = Vector<bssl::CertCompressionAlg>::end(&psVar10->cert_compression_algs);
        for (; __end1 != pCVar11; __end1 = __end1 + 1) {
          compressed.u._24_8_ = __end1;
          if (__end1->alg_id == hs->cert_compression_alg_id) {
            __range1 = (Vector<bssl::CertCompressionAlg> *)__end1;
            break;
          }
        }
        if ((__range1 == (Vector<bssl::CertCompressionAlg> *)0x0) ||
           (__range1->data_ == (CertCompressionAlg *)0x0)) {
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                        ,0x213);
          hs_local._7_1_ = false;
        }
        else {
          cbb_00 = &certificate_list.u.base.field_0x18;
          p_Var1 = ssl_00->method->init_message;
          pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
          bVar2 = (*p_Var1)(ssl_00,pcVar4,(CBB *)cbb_00,'\x19');
          if (((bVar2) &&
              (iVar3 = CBB_add_u16((CBB *)cbb_00,hs->cert_compression_alg_id), iVar3 != 0)) &&
             (sVar8 = Array<unsigned_char>::size((Array<unsigned_char> *)&alg), sVar8 < 0x1000000))
          {
            sVar8 = Array<unsigned_char>::size((Array<unsigned_char> *)&alg);
            iVar3 = CBB_add_u24((CBB *)cbb_00,(uint32_t)sVar8);
            if ((iVar3 != 0) &&
               (iVar3 = CBB_add_u24_length_prefixed((CBB *)cbb_00,(CBB *)&hints), iVar3 != 0)) {
              local_2d8 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::get
                                    (&hs->hints);
              local_4d1 = 0;
              if ((local_2d8 != (pointer)0x0) &&
                 ((local_4d1 = 0, (*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0 &&
                  (local_4d1 = 0, local_2d8->cert_compression_alg_id == hs->cert_compression_alg_id)
                  ))) {
                Span<unsigned_char_const>::
                Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                          ((Span<unsigned_char_const> *)&local_2e8,
                           &local_2d8->cert_compression_input);
                Span<unsigned_char>::
                Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                          (&local_308,(Array<unsigned_char> *)&alg);
                Span<unsigned_char_const>::
                Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                          ((Span<unsigned_char_const> *)&local_2f8,&local_308);
                bVar2 = internal::operator==(local_2e8,local_2f8);
                local_4d1 = 0;
                if (bVar2) {
                  bVar2 = Array<unsigned_char>::empty(&local_2d8->cert_compression_output);
                  local_4d1 = bVar2 ^ 0xff;
                }
              }
              if ((local_4d1 & 1) == 0) {
                pCVar11 = __range1->data_;
                puVar12 = Array<unsigned_char>::data((Array<unsigned_char> *)&alg);
                sVar8 = Array<unsigned_char>::size((Array<unsigned_char> *)&alg);
                iVar3 = (*(code *)pCVar11)(ssl_00,&hints,puVar12,sVar8);
                if (iVar3 == 0) {
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                ,0x22f);
                  hs_local._7_1_ = false;
                }
                else if ((local_2d8 == (pointer)0x0) ||
                        ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0)) {
LAB_001c33d8:
                  pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body
                                     );
                  bVar2 = ssl_add_message_cbb(ssl_00,pcVar4);
                  if (bVar2) {
                    hs_local._7_1_ = true;
                  }
                  else {
                    ERR_put_error(0x10,0,0x44,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                  ,0x23d);
                    hs_local._7_1_ = false;
                  }
                }
                else {
                  local_2d8->cert_compression_alg_id = hs->cert_compression_alg_id;
                  pAVar13 = &local_2d8->cert_compression_input;
                  Span<unsigned_char_const>::
                  Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                            ((Span<unsigned_char_const> *)&local_318,(Array<unsigned_char> *)&alg);
                  bVar2 = Array<unsigned_char>::CopyFrom(pAVar13,local_318);
                  if (bVar2) {
                    pAVar13 = &local_2d8->cert_compression_output;
                    puVar7 = CBB_data((CBB *)&hints);
                    sVar8 = CBB_len((CBB *)&hints);
                    Span<const_unsigned_char>::Span(&local_328,puVar7,sVar8);
                    bVar2 = Array<unsigned_char>::CopyFrom(pAVar13,local_328);
                    if (bVar2) goto LAB_001c33d8;
                  }
                  hs_local._7_1_ = false;
                }
              }
              else {
                puVar12 = Array<unsigned_char>::data(&local_2d8->cert_compression_output);
                sVar8 = Array<unsigned_char>::size(&local_2d8->cert_compression_output);
                iVar3 = CBB_add_bytes((CBB *)&hints,puVar12,sVar8);
                if (iVar3 != 0) goto LAB_001c33d8;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                              ,0x22a);
                hs_local._7_1_ = false;
              }
              goto LAB_001c345a;
            }
          }
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                        ,0x21f);
          hs_local._7_1_ = false;
        }
      }
      else {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x206);
        hs_local._7_1_ = false;
      }
LAB_001c345a:
      Array<unsigned_char>::~Array((Array<unsigned_char> *)&alg);
      goto LAB_001c3466;
    }
  }
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                ,0x1bd);
  hs_local._7_1_ = false;
LAB_001c3466:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
  return hs_local._7_1_;
}

Assistant:

bool tls13_add_certificate(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  const SSL_CREDENTIAL *cred = hs->credential.get();

  ScopedCBB cbb;
  CBB *body, body_storage, certificate_list;

  if (hs->cert_compression_negotiated) {
    if (!CBB_init(cbb.get(), 1024)) {
      return false;
    }
    body = cbb.get();
  } else {
    body = &body_storage;
    if (!ssl->method->init_message(ssl, cbb.get(), body, SSL3_MT_CERTIFICATE)) {
      return false;
    }
  }

  if (  // The request context is always empty in the handshake.
      !CBB_add_u8(body, 0) ||
      !CBB_add_u24_length_prefixed(body, &certificate_list)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (hs->credential == nullptr) {
    return ssl_add_message_cbb(ssl, cbb.get());
  }

  assert(hs->credential->UsesX509());
  CRYPTO_BUFFER *leaf_buf = sk_CRYPTO_BUFFER_value(cred->chain.get(), 0);
  CBB leaf, extensions;
  if (!CBB_add_u24_length_prefixed(&certificate_list, &leaf) ||
      !CBB_add_bytes(&leaf, CRYPTO_BUFFER_data(leaf_buf),
                     CRYPTO_BUFFER_len(leaf_buf)) ||
      !CBB_add_u16_length_prefixed(&certificate_list, &extensions)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (hs->scts_requested && cred->signed_cert_timestamp_list != nullptr) {
    CBB contents;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_certificate_timestamp) ||
        !CBB_add_u16_length_prefixed(&extensions, &contents) ||
        !CBB_add_bytes(
            &contents,
            CRYPTO_BUFFER_data(cred->signed_cert_timestamp_list.get()),
            CRYPTO_BUFFER_len(cred->signed_cert_timestamp_list.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (hs->ocsp_stapling_requested && cred->ocsp_response != NULL) {
    CBB contents, ocsp_response;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_status_request) ||
        !CBB_add_u16_length_prefixed(&extensions, &contents) ||
        !CBB_add_u8(&contents, TLSEXT_STATUSTYPE_ocsp) ||
        !CBB_add_u24_length_prefixed(&contents, &ocsp_response) ||
        !CBB_add_bytes(&ocsp_response,
                       CRYPTO_BUFFER_data(cred->ocsp_response.get()),
                       CRYPTO_BUFFER_len(cred->ocsp_response.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (cred->type == SSLCredentialType::kDelegated) {
    CBB child;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_delegated_credential) ||
        !CBB_add_u16_length_prefixed(&extensions, &child) ||
        !CBB_add_bytes(&child, CRYPTO_BUFFER_data(cred->dc.get()),
                       CRYPTO_BUFFER_len(cred->dc.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (hs->matched_peer_trust_anchor) {
    // Let the peer know we matched a requested trust anchor.
    CBB empty_contents;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_trust_anchors) ||        //
        !CBB_add_u16_length_prefixed(&extensions, &empty_contents) ||  //
        !CBB_flush(&extensions)) {
      return false;
    }
  }

  for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(cred->chain.get()); i++) {
    CRYPTO_BUFFER *cert_buf = sk_CRYPTO_BUFFER_value(cred->chain.get(), i);
    CBB child;
    if (!CBB_add_u24_length_prefixed(&certificate_list, &child) ||
        !CBB_add_bytes(&child, CRYPTO_BUFFER_data(cert_buf),
                       CRYPTO_BUFFER_len(cert_buf)) ||
        !CBB_add_u16(&certificate_list, 0 /* no extensions */)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (!hs->cert_compression_negotiated) {
    return ssl_add_message_cbb(ssl, cbb.get());
  }

  Array<uint8_t> msg;
  if (!CBBFinishArray(cbb.get(), &msg)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const CertCompressionAlg *alg = nullptr;
  for (const auto &candidate : ssl->ctx->cert_compression_algs) {
    if (candidate.alg_id == hs->cert_compression_alg_id) {
      alg = &candidate;
      break;
    }
  }

  if (alg == nullptr || alg->compress == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  CBB compressed;
  body = &body_storage;
  if (!ssl->method->init_message(ssl, cbb.get(), body,
                                 SSL3_MT_COMPRESSED_CERTIFICATE) ||
      !CBB_add_u16(body, hs->cert_compression_alg_id) ||
      msg.size() > (1u << 24) - 1 ||  //
      !CBB_add_u24(body, static_cast<uint32_t>(msg.size())) ||
      !CBB_add_u24_length_prefixed(body, &compressed)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (hints && !hs->hints_requested &&
      hints->cert_compression_alg_id == hs->cert_compression_alg_id &&
      hints->cert_compression_input == Span(msg) &&
      !hints->cert_compression_output.empty()) {
    if (!CBB_add_bytes(&compressed, hints->cert_compression_output.data(),
                       hints->cert_compression_output.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  } else {
    if (!alg->compress(ssl, &compressed, msg.data(), msg.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    if (hints && hs->hints_requested) {
      hints->cert_compression_alg_id = hs->cert_compression_alg_id;
      if (!hints->cert_compression_input.CopyFrom(msg) ||
          !hints->cert_compression_output.CopyFrom(
              Span(CBB_data(&compressed), CBB_len(&compressed)))) {
        return false;
      }
    }
  }

  if (!ssl_add_message_cbb(ssl, cbb.get())) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}